

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.h
# Opt level: O0

sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> * __thiscall
klogic::transform::
continuous<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,std::vector<double,std::allocator<double>>>
          (sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
           *__return_storage_ptr__,transform *this,vector<double,_std::allocator<double>_> *values,
          vector<double,_std::allocator<double>_> *desired)

{
  vector<double,_std::allocator<double>_> local_90;
  cvector local_78;
  vector<double,_std::allocator<double>_> local_50;
  cvector local_38;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *desired_local;
  vector<double,_std::allocator<double>_> *values_local;
  
  local_20 = values;
  desired_local = (vector<double,_std::allocator<double>_> *)this;
  values_local = (vector<double,_std::allocator<double>_> *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,(vector<double,_std::allocator<double>_> *)this);
  continuous(&local_38,&local_50);
  std::vector<double,_std::allocator<double>_>::vector(&local_90,local_20);
  continuous(&local_78,&local_90);
  learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
  sample(__return_storage_ptr__,&local_38,&local_78);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector(&local_78);
  std::vector<double,_std::allocator<double>_>::~vector(&local_90);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector(&local_38);
  std::vector<double,_std::allocator<double>_>::~vector(&local_50);
  return __return_storage_ptr__;
}

Assistant:

learning::sample<Desired> continuous(const std::vector<double> &values, const Input &desired) {
            return learning::sample<Desired>(continuous(values), continuous(desired));
        }